

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::check_load_fromArrays(HModel *this)

{
  int XnumCol;
  int XnumRow;
  int XnumNz;
  int XobjSense;
  pointer pdVar1;
  pointer piVar2;
  vector<double,_std::allocator<double>_> XAvalue;
  vector<int,_std::allocator<int>_> XAindex;
  vector<int,_std::allocator<int>_> XAstart;
  vector<double,_std::allocator<double>_> XrowUpper;
  vector<double,_std::allocator<double>_> XrowLower;
  vector<double,_std::allocator<double>_> XcolUpper;
  vector<double,_std::allocator<double>_> XcolLower;
  vector<double,_std::allocator<double>_> XcolCost;
  
  XnumCol = this->numCol;
  XnumRow = this->numRow;
  XnumNz = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[XnumCol];
  XobjSense = this->objSense;
  XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pdVar1 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
            ((vector<double,std::allocator<double>> *)&XcolCost,pdVar1,pdVar1 + XnumCol);
  pdVar1 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
            ((vector<double,std::allocator<double>> *)&XcolLower,pdVar1,pdVar1 + XnumCol);
  pdVar1 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
            ((vector<double,std::allocator<double>> *)&XcolUpper,pdVar1,pdVar1 + XnumCol);
  pdVar1 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
            ((vector<double,std::allocator<double>> *)&XrowLower,pdVar1,pdVar1 + XnumRow);
  pdVar1 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
            ((vector<double,std::allocator<double>> *)&XrowUpper,pdVar1,pdVar1 + XnumRow);
  piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&XAstart,piVar2,piVar2 + (long)XnumCol + 1);
  piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&XAindex,piVar2,piVar2 + XnumNz);
  pdVar1 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
            ((vector<double,std::allocator<double>> *)&XAvalue,pdVar1,pdVar1 + XnumNz);
  clearModel(this);
  load_fromArrays(this,XnumCol,XobjSense,
                  XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,XnumRow,
                  XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,XnumNz,
                  XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  if (XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HModel::check_load_fromArrays() {
  // Use the arrays read from an MPS file to test the routine to
  // read a model passed by arrays. First copy the data.
  int XnumCol = numCol;
  int XnumRow = numRow;
  int XnumNz = Astart[numCol];
  int XobjSense = objSense;
  vector<double> XcolCost;
  vector<double> XcolLower;
  vector<double> XcolUpper;
  vector<double> XrowLower;
  vector<double> XrowUpper;
  vector<int> XAstart;
  vector<int> XAindex;
  vector<double> XAvalue;
  
  XcolCost.assign(&colCost[0], &colCost[0] + XnumCol);
  XcolLower.assign(&colLower[0], &colLower[0] + XnumCol);
  XcolUpper.assign(&colUpper[0], &colUpper[0] + XnumCol);
  XrowLower.assign(&rowLower[0], &rowLower[0] + XnumRow);
  XrowUpper.assign(&rowUpper[0], &rowUpper[0] + XnumRow);
  XAstart.assign(&Astart[0], &Astart[0] + XnumCol + 1);
  XAindex.assign(&Aindex[0], &Aindex[0] + XnumNz);
  XAvalue.assign(&Avalue[0], &Avalue[0] + XnumNz);
  
  clearModel();
  load_fromArrays(XnumCol, XobjSense, &XcolCost[0], &XcolLower[0], &XcolUpper[0],
		  XnumRow, &XrowLower[0], &XrowUpper[0],
		  XnumNz, &XAstart[0], &XAindex[0], &XAvalue[0]);
}